

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O2

void __thiscall el::Logger::initUnflushedCount(Logger *this)

{
  EnumType lIndex;
  EnumType local_2c;
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  base::utils::std::
  _Rb_tree<el::Level,_std::pair<const_el::Level,_unsigned_int>,_std::_Select1st<std::pair<const_el::Level,_unsigned_int>_>,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_unsigned_int>_>_>
  ::clear(&(this->m_unflushedCount)._M_t);
  local_28._8_8_ = &local_2c;
  local_2c = 2;
  local_10 = base::utils::std::
             _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/dependencies/easyloggingpp/src/easylogging++.cc:626:38)>
             ::_M_invoke;
  local_18 = base::utils::std::
             _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/dependencies/easyloggingpp/src/easylogging++.cc:626:38)>
             ::_M_manager;
  local_28._M_unused._M_object = this;
  LevelHelper::forEachLevel((EnumType *)local_28._8_8_,(function<bool_()> *)&local_28);
  base::utils::std::_Function_base::~_Function_base((_Function_base *)&local_28);
  return;
}

Assistant:

void Logger::initUnflushedCount(void) {
  m_unflushedCount.clear();
  base::type::EnumType lIndex = LevelHelper::kMinValid;
  LevelHelper::forEachLevel(&lIndex, [&](void) -> bool {
    m_unflushedCount.insert(std::make_pair(LevelHelper::castFromInt(lIndex), 0));
    return false;
  });
}